

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ut.hpp
# Opt level: O2

bool boost::ext::ut::v1_1_8::detail::on<bool,boost::ext::ut::v1_1_8::events::assertion<bool>>
               (assertion<bool> *event)

{
  bool bVar1;
  
  bVar1 = runner<boost::ext::ut::v1_1_8::reporter<boost::ext::ut::v1_1_8::printer>,_16>::on<bool>
                    ((runner<boost::ext::ut::v1_1_8::reporter<boost::ext::ut::v1_1_8::printer>,_16>
                      *)cfg<boost::ext::ut::v1_1_8::override>,*event);
  return bVar1;
}

Assistant:

[[nodiscard]] constexpr decltype(auto) on(TEvent&& event) {
  return ut::cfg<typename type_traits::identity<override, Ts...>::type>.on(
      static_cast<TEvent&&>(event));
}